

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

string * __thiscall
util::make_string<char_const(&)[20],CylHead&,char_const(&)[9],int&>
          (string *__return_storage_ptr__,util *this,char (*args) [20],CylHead *args_1,
          char (*args_2) [9],int *args_3)

{
  ostringstream local_1a8 [8];
  ostringstream ss;
  int *args_local_3;
  char (*args_local_2) [9];
  CylHead *args_local_1;
  char (*args_local) [20];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::operator<<((ostream *)local_1a8,(char *)this);
  ::operator<<((ostream *)local_1a8,(CylHead *)args);
  std::operator<<((ostream *)local_1a8,(char *)args_1);
  std::ostream::operator<<(local_1a8,*(int *)*args_2);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string make_string(Args&& ... args)
{
    std::ostringstream ss;
    (void)std::initializer_list<bool> {(ss << args, false)...};
    return ss.str();
}